

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * allocate_conn(Curl_easy *data)

{
  size_t sVar1;
  ssl_backend_data *psVar2;
  curl_write_callback p_Var3;
  char *pcVar4;
  bool bVar5;
  curltime cVar6;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  char *ssl;
  size_t totalsize;
  size_t onesize;
  connectdata *conn;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0x588);
  if (data_local == (Curl_easy *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    sVar1 = Curl_ssl->sizeof_ssl_backend_data;
    psVar2 = (ssl_backend_data *)(*Curl_ccalloc)(1,sVar1 << 2);
    if (psVar2 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(data_local);
      data_local = (Curl_easy *)0x0;
    }
    else {
      (data_local->set).sockopt_client = psVar2;
      (data_local->set).postfieldsize = (curl_off_t)psVar2;
      p_Var3 = (curl_write_callback)((long)&psVar2->logger + sVar1);
      (data_local->set).fwrite_header = p_Var3;
      psVar2 = (ssl_backend_data *)(p_Var3 + sVar1);
      (data_local->set).fprogress = (curl_progress_callback)psVar2;
      (data_local->set).ioctl_func = (curl_ioctl_callback)((long)&psVar2->logger + sVar1);
      (data_local->set).mimepost.filename = (char *)&Curl_handler_dummy;
      *(curl_socket_t *)&(data_local->set).writeheader = -1;
      *(curl_socket_t *)((long)&(data_local->set).writeheader + 4) = -1;
      *(curl_socket_t *)&(data_local->set).use_port = -1;
      *(undefined4 *)&(data_local->set).field_0x3c = 0xffffffff;
      (data_local->msg).list.prev = (Curl_llist_element *)0xffffffffffffffff;
      *(int *)&(data_local->set).ssl.primary.clientcert = -1;
      *(int *)((long)&(data_local->set).ssl.primary.clientcert + 4) = -1;
      Curl_conncontrol((connectdata *)data_local,1);
      cVar6 = Curl_now();
      ((curltime *)&(data_local->set).errorbuffer)->tv_sec = cVar6.tv_sec;
      (data_local->set).proxyport = CONCAT44(uStack_3c,cVar6.tv_usec);
      cVar6 = Curl_now();
      (data_local->set).mimepost.datasize = cVar6.tv_sec;
      *(ulong *)&(data_local->set).mimepost.state = CONCAT44(uStack_4c,cVar6.tv_usec);
      *(uchar *)&(data_local->req).httpcode = (data->set).proxytype;
      *(undefined1 *)&(data_local->req).pendingheader = 4;
      bVar5 = false;
      if ((data->set).str[0x15] != (char *)0x0) {
        bVar5 = *(data->set).str[0x15] != '\0';
      }
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xffffffdf | (uint)bVar5 << 5;
      bVar5 = false;
      if ((((*(uint *)((long)&(data_local->set).mimepost.arg + 4) >> 5 & 1) != 0) &&
          (bVar5 = true, (char)(data_local->req).httpcode != '\0')) &&
         (bVar5 = true, (char)(data_local->req).httpcode != '\x01')) {
        bVar5 = (char)(data_local->req).httpcode == '\x02';
      }
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfffffffe | (uint)bVar5;
      bVar5 = false;
      if ((*(uint *)((long)&(data_local->set).mimepost.arg + 4) >> 5 & 1) != 0) {
        bVar5 = ((ulong)(data_local->set).mimepost.arg & 0x100000000) == 0;
      }
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfffffffd | (uint)bVar5 << 1;
      if (((data->set).str[0x16] != (char *)0x0) && (*(data->set).str[0x16] != '\0')) {
        *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
             *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xffffffdf | 0x20;
        *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
             *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfffffffd | 2;
      }
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfffffffb |
           (uint)((data->state).aptr.proxyuser != (char *)0x0) << 2;
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfffffff7 |
           ((uint)(*(ulong *)&(data->set).field_0x8e2 >> 6) & 1) << 3;
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfffbffff |
           ((uint)(*(ulong *)&(data->set).field_0x8e2 >> 0xb) & 1) << 0x12;
      *(uint *)((long)&(data_local->set).mimepost.arg + 4) =
           *(uint *)((long)&(data_local->set).mimepost.arg + 4) & 0xfff7ffff |
           ((uint)(*(ulong *)&(data->set).field_0x8e2 >> 0xc) & 1) << 0x13;
      *(byte *)((long)&(data_local->set).low_speed_limit + 1) =
           *(byte *)((long)&(data_local->set).low_speed_limit + 1) & 0xfb |
           ((byte)(data->set).ssl.primary.field_0x71 >> 2 & 1) << 2;
      *(byte *)((long)&(data_local->set).low_speed_limit + 1) =
           *(byte *)((long)&(data_local->set).low_speed_limit + 1) & 0xfe |
           (data->set).ssl.primary.field_0x71 & 1;
      *(byte *)((long)&(data_local->set).low_speed_limit + 1) =
           *(byte *)((long)&(data_local->set).low_speed_limit + 1) & 0xfd |
           ((byte)(data->set).ssl.primary.field_0x71 >> 1 & 1) << 1;
      *(uchar *)&(data_local->set).low_speed_limit = (data->set).ssl.primary.ssl_options;
      *(byte *)((long)&(data_local->set).mimepost.freefunc + 1) =
           *(byte *)((long)&(data_local->set).mimepost.freefunc + 1) & 0xfb |
           ((byte)(data->set).proxy_ssl.primary.field_0x71 >> 2 & 1) << 2;
      *(byte *)((long)&(data_local->set).mimepost.freefunc + 1) =
           *(byte *)((long)&(data_local->set).mimepost.freefunc + 1) & 0xfe |
           (data->set).proxy_ssl.primary.field_0x71 & 1;
      *(byte *)((long)&(data_local->set).mimepost.freefunc + 1) =
           *(byte *)((long)&(data_local->set).mimepost.freefunc + 1) & 0xfd |
           ((byte)(data->set).proxy_ssl.primary.field_0x71 >> 1 & 1) << 1;
      *(uchar *)&(data_local->set).mimepost.freefunc = (data->set).proxy_ssl.primary.ssl_options;
      *(uchar *)((long)&(data_local->set).ssl.primary.cipher_list13 + 6) = (data->set).ipver;
      *(uchar *)&(data_local->set).ssl.primary.pinned_key = (data->set).connect_only;
      *(uchar *)((long)&(data_local->set).ssl.primary.cipher_list13 + 5) = '\x03';
      Curl_llist_init((Curl_llist *)&(data_local->set).mimepost.state.offset,(Curl_llist_dtor)0x0);
      if ((data->set).str[8] != (char *)0x0) {
        pcVar4 = (*Curl_cstrdup)((data->set).str[8]);
        (data_local->set).ssl.primary.CApath = pcVar4;
        if ((data_local->set).ssl.primary.CApath == (char *)0x0) {
          Curl_llist_destroy((Curl_llist *)&(data_local->set).mimepost.state.offset,(void *)0x0);
          (*Curl_cfree)((data_local->set).ssl.primary.CApath);
          (*Curl_cfree)((data_local->set).sockopt_client);
          (*Curl_cfree)(data_local);
          return (connectdata *)0x0;
        }
      }
      *(int *)&(data_local->set).ssl.primary.CAfile = (data->set).localportrange;
      *(unsigned_short *)&(data_local->set).ssl.primary.cipher_list13 = (data->set).localport;
      *(curl_closesocket_callback *)&data_local->mstate = (data->set).fclosesocket;
      (data_local->msg).list.ptr = (data->set).closesocket_client;
      cVar6 = Curl_now();
      ((curltime *)&(data_local->set).out)->tv_sec = cVar6.tv_sec;
      (data_local->set).in_set = (void *)CONCAT44(uStack_5c,cVar6.tv_usec);
    }
  }
  return (connectdata *)data_local;
}

Assistant:

static struct connectdata *allocate_conn(struct Curl_easy *data)
{
  struct connectdata *conn = calloc(1, sizeof(struct connectdata));
  if(!conn)
    return NULL;

#ifdef USE_SSL
  /* The SSL backend-specific data (ssl_backend_data) objects are allocated as
     a separate array to ensure suitable alignment.
     Note that these backend pointers can be swapped by vtls (eg ssl backend
     data becomes proxy backend data). */
  {
    size_t onesize = Curl_ssl->sizeof_ssl_backend_data;
    size_t totalsize = onesize;
    char *ssl;

#ifndef CURL_DISABLE_FTP
    totalsize *= 2;
#endif
#ifndef CURL_DISABLE_PROXY
    totalsize *= 2;
#endif

    ssl = calloc(1, totalsize);
    if(!ssl) {
      free(conn);
      return NULL;
    }
    conn->ssl_extra = ssl;
    conn->ssl[FIRSTSOCKET].backend = (void *)ssl;
#ifndef CURL_DISABLE_FTP
    ssl += onesize;
    conn->ssl[SECONDARYSOCKET].backend = (void *)ssl;
#endif
#ifndef CURL_DISABLE_PROXY
    ssl += onesize;
    conn->proxy_ssl[FIRSTSOCKET].backend = (void *)ssl;
#ifndef CURL_DISABLE_FTP
    ssl += onesize;
    conn->proxy_ssl[SECONDARYSOCKET].backend = (void *)ssl;
#endif
#endif
  }
#endif

  conn->handler = &Curl_handler_dummy;  /* Be sure we have a handler defined
                                           already from start to avoid NULL
                                           situations and checks */

  /* and we setup a few fields in case we end up actually using this struct */

  conn->sock[FIRSTSOCKET] = CURL_SOCKET_BAD;     /* no file descriptor */
  conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[0] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->tempsock[1] = CURL_SOCKET_BAD; /* no file descriptor */
  conn->connection_id = -1;    /* no ID */
  conn->port = -1; /* unknown at this point */
  conn->remote_port = -1; /* unknown at this point */
#if defined(USE_RECV_BEFORE_SEND_WORKAROUND) && defined(DEBUGBUILD)
  conn->postponed[0].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
  conn->postponed[1].bindsock = CURL_SOCKET_BAD; /* no file descriptor */
#endif /* USE_RECV_BEFORE_SEND_WORKAROUND && DEBUGBUILD */

  /* Default protocol-independent behavior doesn't support persistent
     connections, so we set this to force-close. Protocols that support
     this need to set this to FALSE in their "curl_do" functions. */
  connclose(conn, "Default to force-close");

  /* Store creation time to help future close decision making */
  conn->created = Curl_now();

  /* Store current time to give a baseline to keepalive connection times. */
  conn->keepalive = Curl_now();

#ifndef CURL_DISABLE_PROXY
  conn->http_proxy.proxytype = data->set.proxytype;
  conn->socks_proxy.proxytype = CURLPROXY_SOCKS4;

  /* note that these two proxy bits are now just on what looks to be
     requested, they may be altered down the road */
  conn->bits.proxy = (data->set.str[STRING_PROXY] &&
                      *data->set.str[STRING_PROXY]) ? TRUE : FALSE;
  conn->bits.httpproxy = (conn->bits.proxy &&
                          (conn->http_proxy.proxytype == CURLPROXY_HTTP ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0 ||
                           conn->http_proxy.proxytype == CURLPROXY_HTTPS)) ?
                           TRUE : FALSE;
  conn->bits.socksproxy = (conn->bits.proxy &&
                           !conn->bits.httpproxy) ? TRUE : FALSE;

  if(data->set.str[STRING_PRE_PROXY] && *data->set.str[STRING_PRE_PROXY]) {
    conn->bits.proxy = TRUE;
    conn->bits.socksproxy = TRUE;
  }

  conn->bits.proxy_user_passwd =
    (data->state.aptr.proxyuser) ? TRUE : FALSE;
  conn->bits.tunnel_proxy = data->set.tunnel_thru_httpproxy;
#endif /* CURL_DISABLE_PROXY */

#ifndef CURL_DISABLE_FTP
  conn->bits.ftp_use_epsv = data->set.ftp_use_epsv;
  conn->bits.ftp_use_eprt = data->set.ftp_use_eprt;
#endif
  conn->ssl_config.verifystatus = data->set.ssl.primary.verifystatus;
  conn->ssl_config.verifypeer = data->set.ssl.primary.verifypeer;
  conn->ssl_config.verifyhost = data->set.ssl.primary.verifyhost;
  conn->ssl_config.ssl_options = data->set.ssl.primary.ssl_options;
#ifndef CURL_DISABLE_PROXY
  conn->proxy_ssl_config.verifystatus =
    data->set.proxy_ssl.primary.verifystatus;
  conn->proxy_ssl_config.verifypeer = data->set.proxy_ssl.primary.verifypeer;
  conn->proxy_ssl_config.verifyhost = data->set.proxy_ssl.primary.verifyhost;
  conn->proxy_ssl_config.ssl_options = data->set.proxy_ssl.primary.ssl_options;
#endif
  conn->ip_version = data->set.ipver;
  conn->connect_only = data->set.connect_only;
  conn->transport = TRNSPRT_TCP; /* most of them are TCP streams */

#if !defined(CURL_DISABLE_HTTP) && defined(USE_NTLM) && \
    defined(NTLM_WB_ENABLED)
  conn->ntlm.ntlm_auth_hlpr_socket = CURL_SOCKET_BAD;
  conn->proxyntlm.ntlm_auth_hlpr_socket = CURL_SOCKET_BAD;
#endif

  /* Initialize the easy handle list */
  Curl_llist_init(&conn->easyq, NULL);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CLEAR;
#endif

  /* Store the local bind parameters that will be used for this connection */
  if(data->set.str[STRING_DEVICE]) {
    conn->localdev = strdup(data->set.str[STRING_DEVICE]);
    if(!conn->localdev)
      goto error;
  }
  conn->localportrange = data->set.localportrange;
  conn->localport = data->set.localport;

  /* the close socket stuff needs to be copied to the connection struct as
     it may live on without (this specific) Curl_easy */
  conn->fclosesocket = data->set.fclosesocket;
  conn->closesocket_client = data->set.closesocket_client;
  conn->lastused = Curl_now(); /* used now */

  return conn;
  error:

  Curl_llist_destroy(&conn->easyq, NULL);
  free(conn->localdev);
#ifdef USE_SSL
  free(conn->ssl_extra);
#endif
  free(conn);
  return NULL;
}